

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents,_Bool hpa)

{
  byte *oldp;
  size_t size;
  long lVar1;
  undefined1 miblen_00 [8];
  emitter_row_t eVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  tsd_t *tsd;
  undefined1 *puVar6;
  tsd_t *ptVar7;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  size_t *psVar8;
  size_t *psVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  char *format;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar11;
  uint uVar12;
  emitter_t *emitter_00;
  size_t sStack_340;
  size_t local_338;
  size_t stats_mutexes_mib [7];
  undefined1 local_2f8 [8];
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_2e8 [4];
  undefined4 local_2c8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_2c0;
  undefined4 local_2a0;
  ulong local_298 [4];
  undefined4 local_278;
  ulong local_270;
  undefined4 local_250;
  ulong local_248 [4];
  undefined4 local_228;
  ulong local_220;
  undefined4 local_200;
  ulong local_1f8 [4];
  undefined4 local_1d8;
  ulong local_1d0;
  undefined4 local_1b0;
  ulong local_1a8 [4];
  undefined4 local_188;
  ulong local_180;
  undefined4 local_160;
  undefined1 local_158 [24];
  undefined1 local_140 [8];
  emitter_col_t name;
  emitter_col_t col32 [1];
  size_t metadata_thp;
  size_t mapped;
  size_t retained;
  size_t num_background_threads;
  size_t zero_reallocs;
  uint64_t background_thread_num_runs;
  uint64_t background_thread_run_interval;
  emitter_row_t row;
  uint64_t uptime;
  undefined8 local_a0;
  size_t allocated;
  size_t active;
  size_t metadata;
  size_t metadata_edata;
  size_t metadata_rtree;
  size_t resident;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  uint local_50;
  uint local_4c;
  size_t local_48;
  size_t miblen;
  size_t local_38;
  size_t sz_13;
  
  psVar8 = &local_338;
  psVar9 = &local_338;
  local_54 = (undefined4)CONCAT71(in_register_00000009,unmerged);
  local_5c = (undefined4)CONCAT71(in_register_00000011,destroyed);
  local_58 = (undefined4)CONCAT71(in_register_00000031,merged);
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x1210511;
  iVar5 = duckdb_je_mallctl("stats.allocated",&local_a0,(size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.allocated";
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x121053f;
  iVar5 = duckdb_je_mallctl("stats.active",&allocated,(size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.active";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x121056d;
  iVar5 = duckdb_je_mallctl("stats.metadata",&active,(size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.metadata";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x1210598;
  iVar5 = duckdb_je_mallctl("stats.metadata_edata",&metadata,(size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.metadata_edata";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x12105c3;
  iVar5 = duckdb_je_mallctl("stats.metadata_rtree",&metadata_edata,(size_t *)local_2f8,(void *)0x0,0
                           );
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.metadata_rtree";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x12105f1;
  iVar5 = duckdb_je_mallctl("stats.metadata_thp",&col32[0].link.qre_prev,(size_t *)local_2f8,
                            (void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.metadata_thp";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x121061c;
  iVar5 = duckdb_je_mallctl("stats.resident",&metadata_rtree,(size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.resident";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x121064a;
  iVar5 = duckdb_je_mallctl("stats.mapped",&metadata_thp,(size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.mapped";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x1210678;
  iVar5 = duckdb_je_mallctl("stats.retained",&mapped,(size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.retained";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x12106a6;
  iVar5 = duckdb_je_mallctl("stats.zero_reallocs",&num_background_threads,(size_t *)local_2f8,
                            (void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.zero_reallocs";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x12106d4;
  iVar5 = duckdb_je_mallctl("stats.background_thread.num_threads",&retained,(size_t *)local_2f8,
                            (void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.background_thread.num_threads";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x1210702;
  iVar5 = duckdb_je_mallctl("stats.background_thread.num_runs",&zero_reallocs,(size_t *)local_2f8,
                            (void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.background_thread.num_runs";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  local_4c = (uint)CONCAT71(in_register_00000081,bins);
  local_50 = (uint)CONCAT71(in_register_00000089,large);
  local_2f8 = (undefined1  [8])0x8;
  sStack_340 = 0x1210737;
  iVar5 = duckdb_je_mallctl("stats.background_thread.run_interval",&background_thread_num_runs,
                            (size_t *)local_2f8,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar10 = "stats.background_thread.run_interval";
    psVar9 = &local_338;
    goto LAB_012113fd;
  }
  sStack_340 = 0x121074e;
  emitter_json_object_kv_begin(emitter,"stats");
  sStack_340 = 0x1210769;
  emitter_json_kv(emitter,"allocated",emitter_type_size,&local_a0);
  sStack_340 = 0x1210781;
  emitter_json_kv(emitter,"active",emitter_type_size,&allocated);
  sStack_340 = 0x1210799;
  emitter_json_kv(emitter,"metadata",emitter_type_size,&active);
  sStack_340 = 0x12107ae;
  emitter_json_kv(emitter,"metadata_edata",emitter_type_size,&metadata);
  sStack_340 = 0x12107c3;
  emitter_json_kv(emitter,"metadata_rtree",emitter_type_size,&metadata_edata);
  sStack_340 = 0x12107de;
  emitter_json_kv(emitter,"metadata_thp",emitter_type_size,&col32[0].link.qre_prev);
  sStack_340 = 0x12107f3;
  emitter_json_kv(emitter,"resident",emitter_type_size,&metadata_rtree);
  sStack_340 = 0x121080e;
  emitter_json_kv(emitter,"mapped",emitter_type_size,&metadata_thp);
  sStack_340 = 0x121082e;
  miblen = (size_t)emitter;
  emitter_json_kv(emitter,"retained",emitter_type_size,&mapped);
  sStack_340 = 0x121084a;
  emitter_json_kv((emitter_t *)miblen,"zero_reallocs",emitter_type_size,&num_background_threads);
  emitter_table_printf
            ((emitter_t *)miblen,
             "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, mapped: %zu, retained: %zu\n"
             ,local_a0,allocated,active,col32[0].link.qre_prev,metadata,metadata_edata,
             metadata_rtree);
  sStack_340 = 0x12108b7;
  emitter_table_printf
            ((emitter_t *)miblen,"Count of realloc(non-null-ptr, 0) calls: %zu\n",
             num_background_threads);
  sStack_340 = 0x12108c7;
  emitter_json_object_kv_begin((emitter_t *)miblen,"background_thread");
  sStack_340 = 0x12108e3;
  emitter_json_kv((emitter_t *)miblen,"num_threads",emitter_type_size,&retained);
  sStack_340 = 0x1210902;
  emitter_json_kv((emitter_t *)miblen,"num_runs",emitter_type_uint64,&zero_reallocs);
  sStack_340 = 0x121091e;
  emitter_json_kv((emitter_t *)miblen,"run_interval",emitter_type_uint64,&background_thread_num_runs
                 );
  sStack_340 = 0x1210927;
  emitter_json_object_end((emitter_t *)miblen);
  emitter_00 = (emitter_t *)miblen;
  sStack_340 = 0x1210946;
  emitter_table_printf
            ((emitter_t *)miblen,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",
             retained);
  if (mutex) {
    background_thread_run_interval = 0;
    sStack_340 = 0x121097f;
    mutex_stats_init_cols
              ((emitter_row_t *)&background_thread_run_interval,anon_var_dwarf_3b6586a + 9,
               (emitter_col_t *)local_140,(emitter_col_t *)local_2f8,
               (emitter_col_t *)&name.link.qre_prev);
    sStack_340 = 0x121098a;
    emitter_table_row(emitter_00,(emitter_row_t *)&background_thread_run_interval);
    sStack_340 = 0x1210999;
    emitter_json_object_kv_begin(emitter_00,"mutexes");
    local_48 = 7;
    local_38 = 8;
    sStack_340 = 0x12109bf;
    iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.uptime",&local_338,&local_48);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar10 = "stats.arenas.0.uptime";
      psVar9 = &local_338;
      goto LAB_012113fd;
    }
    stats_mutexes_mib[1] = 0;
    sStack_340 = 0x12109ed;
    iVar5 = duckdb_je_mallctlbymib(&local_338,local_48,&row,&local_38,(void *)0x0,0);
    psVar9 = &local_338;
    if (iVar5 == 0) {
      local_48 = 7;
      sStack_340 = 0x1210a0d;
      tsd = (tsd_t *)__tls_get_addr(&PTR_027f6ac0);
      ptVar7 = tsd;
      if ((tsd->state).repr != '\0') {
        sStack_340 = 0x12112bf;
        ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      sStack_340 = 0x1210a39;
      iVar5 = duckdb_je_ctl_mibnametomib(ptVar7,&local_338,0,"stats.mutexes",&local_48);
      if (iVar5 != 0) {
LAB_012112e1:
        pcVar10 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
        goto LAB_012112ce;
      }
      puVar6 = (undefined1 *)0x0;
      while (emitter_00 = (emitter_t *)miblen, eVar2.cols.qlh_first = row.cols.qlh_first,
            puVar6 != (undefined1 *)0x48) {
        pcVar10 = *(char **)(puVar6 + 0x27e9aa0);
        local_48 = 7;
        ptVar7 = tsd;
        local_68 = puVar6;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210f53;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        sStack_340 = 0x1210a98;
        iVar5 = duckdb_je_ctl_mibnametomib(ptVar7,&local_338,2,pcVar10,&local_48);
        if (iVar5 != 0) goto LAB_012112e1;
        sz = CONCAT44(sz._4_4_,5);
        local_48 = 7;
        local_38 = 8;
        ptVar7 = tsd;
        name._8_8_ = pcVar10;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210f65;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar7,&local_338,3,"num_ops",&local_48,local_2e8,&local_38,(void *)0x0,0
                          );
        if (iVar5 != 0) {
LAB_012112c7:
          pcVar10 = "<jemalloc>: Failure in ctl_bymibname()\n";
          psVar8 = &local_338;
          goto LAB_012112ce;
        }
        local_2c8 = 5;
        if (local_2e8[0].uint64_val == 0 || eVar2.cols.qlh_first == (emitter_col_t *)0x0) {
          local_2c0.uint64_val = 0;
        }
        else {
          local_2c0 = local_2e8[0];
          if ((emitter_col_t *)0x3b9ac9ff < (ulong)eVar2.cols.qlh_first) {
            local_2c0.uint64_val =
                 local_2e8[0].uint64_val / ((ulong)eVar2.cols.qlh_first / 1000000000);
          }
        }
        local_2a0 = 5;
        local_48 = 7;
        local_38 = 8;
        ptVar7 = tsd;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210f77;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar7,&local_338,3,"num_wait",&local_48,local_298,&local_38,(void *)0x0,
                           0);
        if (iVar5 != 0) goto LAB_012112c7;
        local_278 = 5;
        if (local_298[0] == 0 || eVar2.cols.qlh_first == (emitter_col_t *)0x0) {
          local_270 = 0;
        }
        else {
          local_270 = local_298[0];
          if ((emitter_col_t *)0x3b9ac9ff < (ulong)eVar2.cols.qlh_first) {
            local_270 = local_298[0] / ((ulong)eVar2.cols.qlh_first / 1000000000);
          }
        }
        local_250 = 5;
        local_48 = 7;
        local_38 = 8;
        ptVar7 = tsd;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210f89;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar7,&local_338,3,"num_spin_acq",&local_48,local_248,&local_38,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_012112c7;
        local_228 = 5;
        if (local_248[0] == 0 || eVar2.cols.qlh_first == (emitter_col_t *)0x0) {
          local_220 = 0;
        }
        else {
          local_220 = local_248[0];
          if ((emitter_col_t *)0x3b9ac9ff < (ulong)eVar2.cols.qlh_first) {
            local_220 = local_248[0] / ((ulong)eVar2.cols.qlh_first / 1000000000);
          }
        }
        local_200 = 5;
        local_48 = 7;
        local_38 = 8;
        ptVar7 = tsd;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210f9b;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar7,&local_338,3,"num_owner_switch",&local_48,local_1f8,&local_38,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_012112c7;
        local_1d8 = 5;
        if (local_1f8[0] == 0 || eVar2.cols.qlh_first == (emitter_col_t *)0x0) {
          local_1d0 = 0;
        }
        else {
          local_1d0 = local_1f8[0];
          if ((emitter_col_t *)0x3b9ac9ff < (ulong)eVar2.cols.qlh_first) {
            local_1d0 = local_1f8[0] / ((ulong)eVar2.cols.qlh_first / 1000000000);
          }
        }
        local_1b0 = 5;
        local_48 = 7;
        local_38 = 8;
        ptVar7 = tsd;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210fad;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar7,&local_338,3,"total_wait_time",&local_48,local_1a8,&local_38,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_012112c7;
        local_188 = 5;
        if (local_1a8[0] == 0 || eVar2.cols.qlh_first == (emitter_col_t *)0x0) {
          local_180 = 0;
        }
        else {
          local_180 = local_1a8[0];
          if ((emitter_col_t *)0x3b9ac9ff < (ulong)eVar2.cols.qlh_first) {
            local_180 = local_1a8[0] / ((ulong)eVar2.cols.qlh_first / 1000000000);
          }
        }
        local_160 = 5;
        local_48 = 7;
        local_38 = 8;
        ptVar7 = tsd;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210fbf;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar7,&local_338,3,"max_wait_time",&local_48,local_158,&local_38,
                           (void *)0x0,0);
        if (iVar5 != 0) goto LAB_012112c7;
        col32[0].justify = 4;
        local_48 = 7;
        local_38 = 4;
        ptVar7 = tsd;
        if ((tsd->state).repr != '\0') {
          sStack_340 = 0x1210fd1;
          ptVar7 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar5 = duckdb_je_ctl_bymibname
                          (ptVar7,&local_338,3,"max_num_thds",&local_48,&col32[0].type,&local_38,
                           (void *)0x0,0);
        sVar4 = miblen;
        if (iVar5 != 0) goto LAB_012112c7;
        sStack_340 = 0x1210f17;
        emitter_json_object_kv_begin((emitter_t *)miblen,pcVar10);
        sStack_340 = 0x1210f34;
        mutex_stats_emit((emitter_t *)sVar4,(emitter_row_t *)&background_thread_run_interval,
                         (emitter_col_t *)local_2f8,(emitter_col_t *)&name.link.qre_prev);
        sStack_340 = 0x1210f3c;
        emitter_json_object_end((emitter_t *)sVar4);
        puVar6 = local_68 + 8;
      }
      sStack_340 = 0x1210fe5;
      emitter_json_object_end((emitter_t *)miblen);
      goto LAB_01210fe5;
    }
  }
  else {
LAB_01210fe5:
    sStack_340 = 0x1210fed;
    emitter_json_object_end(emitter_00);
    if ((byte)((byte)local_58 | (byte)local_5c | (byte)local_54) != 1) {
      return;
    }
    sStack_340 = 0x121100d;
    emitter_json_object_kv_begin(emitter_00,"stats.arenas");
    local_2f8 = (undefined1  [8])0x4;
    sStack_340 = 0x1211030;
    iVar5 = duckdb_je_mallctl("arenas.narenas",&local_48,(size_t *)local_2f8,(void *)0x0,0);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar10 = "arenas.narenas";
      psVar9 = &local_338;
LAB_012113fd:
      *(undefined8 *)((long)psVar9 + -8) = 0x1211404;
      duckdb_je_malloc_printf(format,pcVar10);
      *(code **)((long)psVar9 + -8) = stats_arena_print;
      abort();
    }
    local_140 = (undefined1  [8])0x3;
    lVar1 = -((local_48 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
    psVar9 = (size_t *)((long)&local_338 + lVar1);
    local_68 = (undefined1 *)psVar9;
    *(undefined8 *)((long)&sStack_340 + lVar1) = 0x1211078;
    iVar5 = duckdb_je_mallctlnametomib
                      ("arena.0.initialized",(size_t *)local_2f8,(size_t *)local_140);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar10 = "arena.0.initialized";
      goto LAB_012113fd;
    }
    uVar12 = 0;
    for (uVar11 = 0; miblen_00 = local_140, uVar11 < (local_48 & 0xffffffff); uVar11 = uVar11 + 1) {
      name.link.qre_prev = (emitter_col_t *)0x1;
      oldp = local_68 + uVar11;
      sz = uVar11;
      *(undefined8 *)((long)&sStack_340 + lVar1) = 0x12110d1;
      iVar5 = duckdb_je_mallctlbymib
                        ((size_t *)local_2f8,(size_t)miblen_00,oldp,(size_t *)&name.link.qre_prev,
                         (void *)0x0,0);
      if (iVar5 != 0) goto LAB_012112d8;
      uVar12 = uVar12 + *oldp;
    }
    sz = 0x1001;
    name.link.qre_prev = (emitter_col_t *)0x1;
    *(undefined8 *)((long)&sStack_340 + lVar1) = 0x1211118;
    iVar5 = duckdb_je_mallctlbymib
                      ((size_t *)local_2f8,(size_t)miblen_00,&local_38,(size_t *)&name.link.qre_prev
                       ,(void *)0x0,0);
    sVar4 = miblen;
    if (iVar5 == 0) {
      resident = (ulong)hpa;
      local_4c = local_4c & 0xff;
      local_50 = local_50 & 0xff;
      if (((char)local_58 != '\0') && ((uVar12 < 2 & (byte)local_54) == 0)) {
        *(undefined8 *)((long)&sStack_340 + lVar1) = 0x1211224;
        emitter_table_printf((emitter_t *)sVar4,"Merged arenas stats:\n");
        *(undefined8 *)((long)&sStack_340 + lVar1) = 0x1211233;
        emitter_json_object_kv_begin((emitter_t *)sVar4,"merged");
        uVar3 = local_4c;
        uVar12 = local_50;
        *(size_t *)((long)stats_mutexes_mib + lVar1 + -0x18) = resident;
        *(undefined8 *)((long)stats_mutexes_mib + lVar1 + -0x20) = 0x1211253;
        stats_arena_print((emitter_t *)sVar4,0x1000,SUB41(uVar3,0),SUB41(uVar12,0),mutex,extents,
                          *(_Bool *)((long)stats_mutexes_mib + lVar1 + -0x18));
        *(undefined8 *)((long)&sStack_340 + lVar1) = 0x121125d;
        emitter_json_object_end((emitter_t *)sVar4);
      }
      sVar4 = miblen;
      if (((byte)local_5c & (byte)local_38) == 1) {
        *(undefined8 *)((long)&sStack_340 + lVar1) = 0x1211277;
        emitter_table_printf((emitter_t *)sVar4,"Destroyed arenas stats:\n");
        *(undefined8 *)((long)&sStack_340 + lVar1) = 0x1211286;
        emitter_json_object_kv_begin((emitter_t *)sVar4,"destroyed");
        uVar3 = local_4c;
        uVar12 = local_50;
        *(size_t *)((long)stats_mutexes_mib + lVar1 + -0x18) = resident;
        *(undefined8 *)((long)stats_mutexes_mib + lVar1 + -0x20) = 0x12112a6;
        stats_arena_print((emitter_t *)sVar4,0x1001,SUB41(uVar3,0),SUB41(uVar12,0),mutex,extents,
                          *(_Bool *)((long)stats_mutexes_mib + lVar1 + -0x18));
        *(undefined8 *)((long)&sStack_340 + lVar1) = 0x12112b0;
        emitter_json_object_end((emitter_t *)sVar4);
      }
      sVar4 = miblen;
      if ((byte)local_54 != '\0') {
        for (uVar11 = 0; uVar11 < (local_48 & 0xffffffff); uVar11 = uVar11 + 1) {
          if (local_68[uVar11] == '\x01') {
            *(undefined8 *)((long)&sStack_340 + lVar1) = 0x14;
            size = *(size_t *)((long)&sStack_340 + lVar1);
            *(undefined8 *)((long)&sStack_340 + lVar1) = 0x12111a8;
            duckdb_je_malloc_snprintf((char *)&local_338,size,"%u",uVar11 & 0xffffffff);
            *(undefined8 *)((long)&sStack_340 + lVar1) = 0x12111b3;
            emitter_json_object_kv_begin((emitter_t *)sVar4,(char *)&local_338);
            *(undefined8 *)((long)&sStack_340 + lVar1) = 0x12111c7;
            emitter_table_printf((emitter_t *)sVar4,"arenas[%s]:\n",&local_338);
            uVar3 = local_4c;
            uVar12 = local_50;
            *(size_t *)((long)stats_mutexes_mib + lVar1 + -0x18) = resident;
            *(undefined8 *)((long)stats_mutexes_mib + lVar1 + -0x20) = 0x12111e4;
            stats_arena_print((emitter_t *)sVar4,(uint)uVar11,SUB41(uVar3,0),SUB41(uVar12,0),mutex,
                              extents,*(_Bool *)((long)stats_mutexes_mib + lVar1 + -0x18));
            *(undefined8 *)((long)&sStack_340 + lVar1) = 0x12111ee;
            emitter_json_object_end((emitter_t *)sVar4);
          }
        }
      }
      sVar4 = miblen;
      *(undefined8 *)((long)&sStack_340 + lVar1) = 0x12111f9;
      emitter_json_object_end((emitter_t *)sVar4);
      return;
    }
  }
LAB_012112d8:
  psVar8 = psVar9;
  pcVar10 = "<jemalloc>: Failure in xmallctlbymib()\n";
LAB_012112ce:
  *(undefined8 *)((long)psVar8 + -8) = 0x12112d3;
  duckdb_je_malloc_write(pcVar10);
  *(undefined8 *)((long)psVar8 + -8) = 0x12112d8;
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents, bool hpa) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_edata, metadata_rtree,
	    metadata_thp, resident, mapped, retained;
	size_t num_background_threads;
	size_t zero_reallocs;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_edata", &metadata_edata, size_t);
	CTL_GET("stats.metadata_rtree", &metadata_rtree, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	CTL_GET("stats.zero_reallocs", &zero_reallocs, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_edata", emitter_type_size,
	    &metadata_edata);
	emitter_json_kv(emitter, "metadata_rtree", emitter_type_size,
	    &metadata_rtree);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);
	emitter_json_kv(emitter, "zero_reallocs", emitter_type_size,
	    &zero_reallocs);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, "
	    "mapped: %zu, retained: %zu\n", allocated, active, metadata,
		metadata_thp, metadata_edata, metadata_rtree, resident, mapped,
	    retained);

	/* Strange behaviors */
	emitter_table_printf(emitter,
	    "Count of realloc(non-null-ptr, 0) calls: %zu\n", zero_reallocs);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		size_t stats_mutexes_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(stats_mutexes_mib, 0, "stats.mutexes");
		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(stats_mutexes_mib, 2,
			    global_mutex_names[i], &name, col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY_UNSAFE(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents, hpa);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}